

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

Option_group * __thiscall
CLI::App::add_option_group<CLI::Option_group>
          (App *this,string *group_name,string *group_description)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  IncorrectConstruction *this_00;
  shared_ptr<CLI::App> local_98;
  undefined1 local_88 [8];
  App_p app_ptr;
  element_type *ptr;
  undefined1 local_68 [8];
  shared_ptr<CLI::Option_group> option_group;
  allocator local_41;
  string local_40;
  string *local_20;
  string *group_description_local;
  string *group_name_local;
  App *this_local;
  
  local_20 = group_description;
  group_description_local = group_name;
  group_name_local = (string *)this;
  bVar2 = detail::valid_alias_name_string(group_name);
  if (!bVar2) {
    option_group.super___shared_ptr<CLI::Option_group,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._3_1_ = 1;
    this_00 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_40,"option group names may not contain newlines or null characters",
               &local_41);
    IncorrectConstruction::IncorrectConstruction(this_00,&local_40);
    option_group.super___shared_ptr<CLI::Option_group,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ._3_1_ = 0;
    __cxa_throw(this_00,&IncorrectConstruction::typeinfo,
                IncorrectConstruction::~IncorrectConstruction);
  }
  ::std::make_shared<CLI::Option_group,std::__cxx11::string,std::__cxx11::string&,CLI::App*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             group_description,(App **)group_name);
  app_ptr.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__shared_ptr<CLI::Option_group,_(__gnu_cxx::_Lock_policy)2>::get
                 ((__shared_ptr<CLI::Option_group,_(__gnu_cxx::_Lock_policy)2> *)local_68);
  ::std::dynamic_pointer_cast<CLI::App,CLI::Option_group>((shared_ptr<CLI::Option_group> *)local_88)
  ;
  std::shared_ptr<CLI::App>::shared_ptr(&local_98,(shared_ptr<CLI::App> *)local_88);
  add_subcommand(this,&local_98);
  std::shared_ptr<CLI::App>::~shared_ptr(&local_98);
  _Var1 = app_ptr.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)local_88);
  std::shared_ptr<CLI::Option_group>::~shared_ptr((shared_ptr<CLI::Option_group> *)local_68);
  return (Option_group *)_Var1._M_pi;
}

Assistant:

T *add_option_group(std::string group_name, std::string group_description = "") {
        if(!detail::valid_alias_name_string(group_name)) {
            throw IncorrectConstruction("option group names may not contain newlines or null characters");
        }
        auto option_group = std::make_shared<T>(std::move(group_description), group_name, this);
        auto *ptr = option_group.get();
        // move to App_p for overload resolution on older gcc versions
        App_p app_ptr = std::dynamic_pointer_cast<App>(option_group);
        add_subcommand(std::move(app_ptr));
        return ptr;
    }